

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphicsplugin_factory.cpp
# Opt level: O0

shared_ptr<IGraphicsPlugin>
CreateGraphicsPlugin(shared_ptr<Options> *options,shared_ptr<IPlatformPlugin> *platformPlugin)

{
  bool bVar1;
  ulong uVar2;
  element_type *__x;
  invalid_argument *piVar3;
  undefined8 uVar4;
  pointer ppVar5;
  shared_ptr<IPlatformPlugin> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<IGraphicsPlugin> sVar6;
  shared_ptr<IPlatformPlugin> local_78;
  undefined1 local_61;
  string local_60 [32];
  _Self local_40;
  _Self local_38;
  iterator apiIt;
  shared_ptr<IPlatformPlugin> *platformPlugin_local;
  shared_ptr<Options> *options_local;
  
  std::__shared_ptr_access<Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Options,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             platformPlugin);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"No graphics API specified");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  __x = std::__shared_ptr_access<Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Options,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   platformPlugin);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>,_IgnoreCaseStringLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>,_IgnoreCaseStringLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>_>_>_>
               *)(anonymous_namespace)::graphicsPluginMap_abi_cxx11_,&__x->GraphicsPlugin);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>,_IgnoreCaseStringLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>,_IgnoreCaseStringLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>_>_>_>
              *)(anonymous_namespace)::graphicsPluginMap_abi_cxx11_);
  bVar1 = std::operator==(&local_38,&local_40);
  if (!bVar1) {
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>_>_>
             ::operator->(&local_38);
    std::shared_ptr<IPlatformPlugin>::shared_ptr(&local_78,in_RDX);
    std::
    function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>
    ::operator()((function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>
                  *)options,(shared_ptr<Options> *)&ppVar5->second,platformPlugin);
    std::shared_ptr<IPlatformPlugin>::~shared_ptr(&local_78);
    sVar6.super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar6.super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)options;
    return (shared_ptr<IGraphicsPlugin>)
           sVar6.super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>;
  }
  local_61 = 1;
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__shared_ptr_access<Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Options,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             platformPlugin);
  uVar4 = std::__cxx11::string::c_str();
  Fmt_abi_cxx11_((char *)local_60,"Unsupported graphics API \'%s\'",uVar4);
  std::invalid_argument::invalid_argument(piVar3,local_60);
  local_61 = 0;
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::shared_ptr<IGraphicsPlugin> CreateGraphicsPlugin(const std::shared_ptr<Options>& options,
                                                      std::shared_ptr<IPlatformPlugin> platformPlugin) {
    if (options->GraphicsPlugin.empty()) {
        throw std::invalid_argument("No graphics API specified");
    }

    const auto apiIt = graphicsPluginMap.find(options->GraphicsPlugin);
    if (apiIt == graphicsPluginMap.end()) {
        throw std::invalid_argument(Fmt("Unsupported graphics API '%s'", options->GraphicsPlugin.c_str()));
    }

    return apiIt->second(options, std::move(platformPlugin));
}